

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlDtdPtr xmlGetIntSubset(xmlDoc *doc)

{
  _xmlNode **pp_Var1;
  xmlDtdPtr pxVar2;
  
  if (doc == (xmlDoc *)0x0) {
    pxVar2 = (xmlDtdPtr)0x0;
  }
  else {
    pp_Var1 = &doc->children;
    while( true ) {
      pxVar2 = (xmlDtdPtr)*pp_Var1;
      if (pxVar2 == (xmlDtdPtr)0x0) {
        return doc->intSubset;
      }
      if (pxVar2->type == XML_DTD_NODE) break;
      pp_Var1 = &pxVar2->next;
    }
  }
  return pxVar2;
}

Assistant:

xmlDtdPtr
xmlGetIntSubset(const xmlDoc *doc) {
    xmlNodePtr cur;

    if (doc == NULL)
	return(NULL);
    cur = doc->children;
    while (cur != NULL) {
	if (cur->type == XML_DTD_NODE)
	    return((xmlDtdPtr) cur);
	cur = cur->next;
    }
    return((xmlDtdPtr) doc->intSubset);
}